

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asio_service.cxx
# Opt level: O0

void __thiscall cornerstone::rpc_session::~rpc_session(rpc_session *this)

{
  undefined1 uVar1;
  int in_ESI;
  long in_RDI;
  undefined7 in_stack_fffffffffffffff0;
  undefined1 in_stack_fffffffffffffff7;
  
  uVar1 = asio::basic_socket<asio::ip::tcp,_asio::any_io_executor>::is_open
                    ((basic_socket<asio::ip::tcp,_asio::any_io_executor> *)
                     CONCAT17(in_stack_fffffffffffffff7,in_stack_fffffffffffffff0));
  if ((bool)uVar1) {
    asio::basic_socket<asio::ip::tcp,_asio::any_io_executor>::close
              ((basic_socket<asio::ip::tcp,_asio::any_io_executor> *)(in_RDI + 0x20),in_ESI);
  }
  std::function<void_(const_std::shared_ptr<cornerstone::rpc_session>_&)>::~function
            ((function<void_(const_std::shared_ptr<cornerstone::rpc_session>_&)> *)0x1a4dec);
  std::shared_ptr<cornerstone::logger>::~shared_ptr((shared_ptr<cornerstone::logger> *)0x1a4dfc);
  std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>::~unique_ptr
            ((unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)> *)
             CONCAT17(uVar1,in_stack_fffffffffffffff0));
  std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>::~unique_ptr
            ((unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)> *)
             CONCAT17(uVar1,in_stack_fffffffffffffff0));
  asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>::~basic_stream_socket
            ((basic_stream_socket<asio::ip::tcp,_asio::any_io_executor> *)0x1a4e26);
  std::shared_ptr<cornerstone::raft_server>::~shared_ptr
            ((shared_ptr<cornerstone::raft_server> *)0x1a4e33);
  std::enable_shared_from_this<cornerstone::rpc_session>::~enable_shared_from_this
            ((enable_shared_from_this<cornerstone::rpc_session> *)0x1a4e3c);
  return;
}

Assistant:

~rpc_session()
    {
        if (socket_.is_open())
        {
            socket_.close();
        }
    }